

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_funcinfo(lua_State *L)

{
  BCPos pc;
  BCLine val;
  GCproto *pt;
  GCstr *pGVar1;
  TValue *pTVar2;
  GCtab *pGVar3;
  ulong uVar4;
  
  pt = check_Lproto(L,1);
  if (pt == (GCproto *)0x0) {
    uVar4 = (ulong)(L->base->u32).lo;
    lua_createtable(L,0,4);
    pGVar3 = (GCtab *)(ulong)L->top[-1].u32.lo;
    if (*(byte *)(uVar4 + 6) != 1) {
      setintfield(L,pGVar3,"ffid",(uint)*(byte *)(uVar4 + 6));
    }
    pGVar1 = lj_str_new(L,"addr",4);
    pTVar2 = lj_tab_setstr(L,pGVar3,pGVar1);
    pTVar2->n = (double)*(long *)(uVar4 + 0x18);
    setintfield(L,pGVar3,"upvalues",(uint)*(byte *)(uVar4 + 7));
  }
  else {
    pc = lj_lib_optint(L,2,0);
    lua_createtable(L,0,0x10);
    pGVar3 = (GCtab *)(ulong)L->top[-1].u32.lo;
    setintfield(L,pGVar3,"linedefined",pt->firstline);
    setintfield(L,pGVar3,"lastlinedefined",pt->numline + pt->firstline);
    setintfield(L,pGVar3,"stackslots",(uint)pt->framesize);
    setintfield(L,pGVar3,"params",(uint)pt->numparams);
    setintfield(L,pGVar3,"bytecodes",pt->sizebc);
    setintfield(L,pGVar3,"gcconsts",pt->sizekgc);
    setintfield(L,pGVar3,"nconsts",pt->sizekn);
    setintfield(L,pGVar3,"upvalues",(uint)pt->sizeuv);
    if (pc < pt->sizebc) {
      val = lj_debug_line(pt,pc);
      setintfield(L,pGVar3,"currentline",val);
    }
    lua_pushboolean(L,pt->flags & 2);
    lua_setfield(L,-2,"isvararg");
    lua_pushboolean(L,pt->flags & 1);
    lua_setfield(L,-2,"children");
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    (pTVar2->field_2).field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
         (pt->chunkname).gcptr32;
    (pTVar2->field_2).it = 0xfffffffb;
    lua_setfield(L,-2,"source");
    lj_debug_pushloc(L,pt,pc);
    lua_setfield(L,-2,"loc");
    pGVar1 = lj_str_new(L,"proto",5);
    pTVar2 = lj_tab_setstr(L,pGVar3,pGVar1);
    (pTVar2->u32).lo = (uint32_t)pt;
    (pTVar2->field_2).it = 0xfffffff8;
  }
  return 1;
}

Assistant:

LJLIB_CF(jit_util_funcinfo)
{
  GCproto *pt = check_Lproto(L, 1);
  if (pt) {
    BCPos pc = (BCPos)lj_lib_optint(L, 2, 0);
    GCtab *t;
    lua_createtable(L, 0, 16);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "linedefined", pt->firstline);
    setintfield(L, t, "lastlinedefined", pt->firstline + pt->numline);
    setintfield(L, t, "stackslots", pt->framesize);
    setintfield(L, t, "params", pt->numparams);
    setintfield(L, t, "bytecodes", (int32_t)pt->sizebc);
    setintfield(L, t, "gcconsts", (int32_t)pt->sizekgc);
    setintfield(L, t, "nconsts", (int32_t)pt->sizekn);
    setintfield(L, t, "upvalues", (int32_t)pt->sizeuv);
    if (pc < pt->sizebc)
      setintfield(L, t, "currentline", lj_debug_line(pt, pc));
    lua_pushboolean(L, (pt->flags & PROTO_VARARG));
    lua_setfield(L, -2, "isvararg");
    lua_pushboolean(L, (pt->flags & PROTO_CHILD));
    lua_setfield(L, -2, "children");
    setstrV(L, L->top++, proto_chunkname(pt));
    lua_setfield(L, -2, "source");
    lj_debug_pushloc(L, pt, pc);
    lua_setfield(L, -2, "loc");
    setprotoV(L, lj_tab_setstr(L, t, lj_str_newlit(L, "proto")), pt);
  } else {
    GCfunc *fn = funcV(L->base);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    if (!iscfunc(fn))
      setintfield(L, t, "ffid", fn->c.ffid);
    setintptrV(lj_tab_setstr(L, t, lj_str_newlit(L, "addr")),
	       (intptr_t)(void *)fn->c.f);
    setintfield(L, t, "upvalues", fn->c.nupvalues);
  }
  return 1;
}